

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

NewOpRequirements __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GetNewOp
          (MessageGenerator *this,Printer *arena_emitter)

{
  size_t sVar1;
  bool bVar2;
  ArenaDtorNeeds AVar3;
  int iVar4;
  CppType CVar5;
  CType CVar6;
  FileDescriptor *pFVar7;
  OneofDescriptor *pOVar8;
  LogMessage *pLVar9;
  Iterator IVar10;
  NewOpRequirements local_144;
  LogMessageFatal local_140 [23];
  Voidify local_129;
  LogMessageFatal local_128 [19];
  Voidify local_115 [20];
  byte local_101;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  LogMessageFatal local_f0 [23];
  Voidify local_d9;
  string_view local_d8;
  FieldGenerator *local_c8;
  FieldGenerator *generator;
  string_view local_b0;
  string_view local_a0;
  undefined1 local_90 [8];
  anon_class_24_3_fa050984 print_arena_offset;
  FieldDescriptor *field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_t local_28;
  size_t arena_seeding_count;
  Printer *arena_emitter_local;
  MessageGenerator *this_local;
  NewOpRequirements op;
  
  local_28 = 0;
  arena_seeding_count = (size_t)arena_emitter;
  arena_emitter_local = (Printer *)this;
  NewOpRequirements::NewOpRequirements((NewOpRequirements *)((long)&this_local + 5));
  pFVar7 = Descriptor::file(this->descriptor_);
  bVar2 = IsBootstrapProto(&this->options_,pFVar7);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    AVar3 = NeedsArenaDestructor(this);
    if (AVar3 == kRequired) {
      this_local._7_1_ = 1;
    }
    iVar4 = Descriptor::extension_range_count(this->descriptor_);
    sVar1 = arena_seeding_count;
    if (0 < iVar4) {
      this_local._5_2_ = CONCAT11(1,this_local._5_1_);
      local_28 = local_28 + 1;
      if (arena_seeding_count != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_38,
                   "\n        PROTOBUF_FIELD_OFFSET($classname$, $extensions$) +\n            decltype($classname$::$extensions$)::InternalGetArenaOffset(\n                $superclass$::internal_visibility()),\n      "
                  );
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)sVar1,local_38._M_len,local_38._M_str);
      }
    }
    if (this->num_weak_fields_ != 0) {
      this_local._7_1_ = 1;
    }
    __begin3.descriptor =
         (Descriptor *)
         protobuf::internal::FieldRange<google::protobuf::Descriptor>(this->descriptor_);
    IVar10 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::begin
                       ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
    __begin3._0_8_ = IVar10.descriptor;
    __end3.descriptor._0_4_ = IVar10.idx;
    IVar10 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::end
                       ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
    __end3._0_8_ = IVar10.descriptor;
    field._0_4_ = IVar10.idx;
    while (bVar2 = protobuf::internal::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field)
          , bVar2) {
      print_arena_offset.field =
           (FieldDescriptor **)
           protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                     ((Iterator *)&__end3.descriptor);
      local_90 = (undefined1  [8])&local_28;
      print_arena_offset.arena_seeding_count = &arena_seeding_count;
      print_arena_offset.arena_emitter = (Printer **)&print_arena_offset.field;
      bVar2 = ShouldSplit((FieldDescriptor *)print_arena_offset.field,&this->options_);
      if (bVar2) {
        this_local._5_2_ = CONCAT11(this_local._6_1_,1);
      }
      else {
        pOVar8 = FieldDescriptor::real_containing_oneof((FieldDescriptor *)print_arena_offset.field)
        ;
        if (pOVar8 == (OneofDescriptor *)0x0) {
          bVar2 = FieldDescriptor::is_map((FieldDescriptor *)print_arena_offset.field);
          if (bVar2) {
            this_local._5_2_ = 0x101;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"");
            GetNewOp::anon_class_24_3_fa050984::operator()
                      ((anon_class_24_3_fa050984 *)local_90,local_a0);
            pFVar7 = Descriptor::file(this->descriptor_);
            bVar2 = HasDescriptorMethods(pFVar7,&this->options_);
            if (bVar2) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_b0,"Alt");
              GetNewOp::anon_class_24_3_fa050984::operator()
                        ((anon_class_24_3_fa050984 *)local_90,local_b0);
            }
          }
          else {
            bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)print_arena_offset.field);
            if (bVar2) {
              this_local._5_2_ = CONCAT11(1,this_local._5_1_);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&generator,"");
              GetNewOp::anon_class_24_3_fa050984::operator()
                        ((anon_class_24_3_fa050984 *)local_90,_generator);
            }
            else {
              local_c8 = FieldGeneratorTable::get
                                   (&this->field_generators_,
                                    (FieldDescriptor *)print_arena_offset.field);
              bVar2 = FieldGenerator::has_trivial_zero_default(local_c8);
              if (!bVar2) {
                CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)print_arena_offset.field);
                if (CVar5 - CPPTYPE_INT32 < 8) {
                  this_local._5_2_ = CONCAT11(this_local._6_1_,1);
                }
                else if (CVar5 == CPPTYPE_STRING) {
                  CVar6 = protobuf::internal::cpp::
                          EffectiveStringCType<google::protobuf::FieldDescriptor,google::protobuf::FieldOptions>
                                    ((FieldDescriptor *)print_arena_offset.field);
                  if (CVar6 == FieldOptions_CType_STRING) {
                    this_local._5_2_ = CONCAT11(this_local._6_1_,1);
                  }
                  else if (CVar6 == FieldOptions_CType_CORD) {
                    local_101 = 0;
                    if (((this_local._7_1_ ^ 0xff) & 1) != 0) {
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (&local_100,"op.needs_to_run_constructor");
                      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                                (local_f0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                                 ,0xf2b,local_100._M_len,local_100._M_str);
                      local_101 = 1;
                      pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                                         ((LogMessage *)local_f0);
                      absl::lts_20240722::log_internal::Voidify::operator&&(&local_d9,pLVar9);
                    }
                    if ((local_101 & 1) != 0) {
                      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_f0);
                    }
                  }
                  else {
                    if (CVar6 != FieldOptions_CType_STRING_PIECE) {
                      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                                (local_128,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                                 ,0xf31);
                      pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                                         ((LogMessage *)local_128);
                      absl::lts_20240722::log_internal::Voidify::operator&&(local_115,pLVar9);
                      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_128)
                      ;
                    }
                    this_local._5_2_ = CONCAT11(1,this_local._5_1_);
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_d8,"");
                    GetNewOp::anon_class_24_3_fa050984::operator()
                              ((anon_class_24_3_fa050984 *)local_90,local_d8);
                  }
                }
                else if (CVar5 == CPPTYPE_MESSAGE) {
                  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                            (local_140,
                             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                             ,0xf35);
                  pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                                     ((LogMessage *)local_140);
                  pLVar9 = absl::lts_20240722::log_internal::LogMessage::operator<<
                                     (pLVar9,(char (*) [38])"Message should be zero initializable.")
                  ;
                  absl::lts_20240722::log_internal::Voidify::operator&&(&local_129,pLVar9);
                  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_140);
                }
              }
            }
          }
        }
      }
      protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
                ((Iterator *)&__end3.descriptor);
    }
    if (0x3f < local_28) {
      this_local._7_1_ = true;
    }
  }
  local_144.needs_to_run_constructor = (bool)this_local._7_1_;
  local_144.needs_memcpy = (bool)this_local._5_1_;
  local_144.needs_arena_seeding = (bool)this_local._6_1_;
  return local_144;
}

Assistant:

MessageGenerator::NewOpRequirements MessageGenerator::GetNewOp(
    io::Printer* arena_emitter) const {
  size_t arena_seeding_count = 0;
  NewOpRequirements op;
  if (IsBootstrapProto(options_, descriptor_->file())) {
    // To simplify bootstrapping we always use a function for these types.
    // It makes it easier to change the ABI of the `MessageCreator` class.
    op.needs_to_run_constructor = true;
    return op;
  }

  if (NeedsArenaDestructor() == ArenaDtorNeeds::kRequired) {
    // We can't skip the ArenaDtor for these messages.
    op.needs_to_run_constructor = true;
  }

  if (descriptor_->extension_range_count() > 0) {
    op.needs_arena_seeding = true;
    ++arena_seeding_count;
    if (arena_emitter) {
      arena_emitter->Emit(R"cc(
        PROTOBUF_FIELD_OFFSET($classname$, $extensions$) +
            decltype($classname$::$extensions$)::InternalGetArenaOffset(
                $superclass$::internal_visibility()),
      )cc");
    }
  }

  if (num_weak_fields_ != 0) {
    op.needs_to_run_constructor = true;
  }

  for (const FieldDescriptor* field : FieldRange(descriptor_)) {
    const auto print_arena_offset = [&](absl::string_view suffix = "") {
      ++arena_seeding_count;
      if (arena_emitter) {
        arena_emitter->Emit(
            {{"field", FieldMemberName(field, false)}, {"suffix", suffix}},
            R"cc(
              PROTOBUF_FIELD_OFFSET($classname$, $field$) +
                  decltype($classname$::$field$)::
                      InternalGetArenaOffset$suffix$(
                          $superclass$::internal_visibility()),
            )cc");
      }
    };
    if (ShouldSplit(field, options_)) {
      op.needs_memcpy = true;
    } else if (field->real_containing_oneof() != nullptr) {
      /* nothing to do */
    } else if (field->is_map()) {
      op.needs_arena_seeding = true;
      // MapField contains an internal vtable pointer we need to copy.
      op.needs_memcpy = true;
      print_arena_offset();
      // Non-lite maps currently have more than one arena pointer in them. Print
      // both.
      if (HasDescriptorMethods(descriptor_->file(), options_)) {
        print_arena_offset("Alt");
      }
    } else if (field->is_repeated()) {
      op.needs_arena_seeding = true;
      print_arena_offset();
    } else {
      const auto& generator = field_generators_.get(field);
      if (generator.has_trivial_zero_default()) {
        /* nothing to do */
      } else {
        switch (field->cpp_type()) {
          case FieldDescriptor::CPPTYPE_INT32:
          case FieldDescriptor::CPPTYPE_INT64:
          case FieldDescriptor::CPPTYPE_UINT32:
          case FieldDescriptor::CPPTYPE_UINT64:
          case FieldDescriptor::CPPTYPE_DOUBLE:
          case FieldDescriptor::CPPTYPE_FLOAT:
          case FieldDescriptor::CPPTYPE_BOOL:
          case FieldDescriptor::CPPTYPE_ENUM:
            op.needs_memcpy = true;
            break;

          case FieldDescriptor::CPPTYPE_STRING:
            switch (internal::cpp::EffectiveStringCType(field)) {
              case FieldOptions::STRING_PIECE:
                op.needs_arena_seeding = true;
                print_arena_offset();
                break;
              case FieldOptions::CORD:
                // Cord fields are currently rejected above because of ArenaDtor
                // requirements.
                ABSL_CHECK(op.needs_to_run_constructor);
                break;
              case FieldOptions::STRING:
                op.needs_memcpy = true;
                break;
              default:
                ABSL_LOG(FATAL);
            }
            break;
          case FieldDescriptor::CPPTYPE_MESSAGE:
            ABSL_LOG(FATAL) << "Message should be zero initializable.";
            break;
        }
      }
    }
  }

  // If we are going to generate too many arena seeding offsets, we can skip the
  // attempt because we know it will fail at compile time and fallback to
  // placement new. The arena seeding code can handle up to an offset of
  // `63 * sizeof(Arena*)`.
  // This prevents generating huge lists that have to be run during constant
  // evaluation to just fail anyway. The actual upper bound is smaller than
  // this, but any reasonable value is enough to prevent long compile times for
  // big messages.
  if (arena_seeding_count >= 64) {
    op.needs_to_run_constructor = true;
  }

  return op;
}